

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator::
ImmutableMessageFieldLiteGenerator
          (ImmutableMessageFieldLiteGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          Context *context)

{
  ClassNameResolver *pCVar1;
  undefined4 in_EDX;
  _func_int **in_RSI;
  ImmutableFieldLiteGenerator *in_RDI;
  FieldDescriptor *in_stack_00000008;
  Context *in_stack_00000010;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000005d0;
  ClassNameResolver *in_stack_000005d8;
  FieldGeneratorInfo *in_stack_000005e0;
  int in_stack_000005e8;
  int in_stack_000005ec;
  FieldDescriptor *in_stack_000005f0;
  
  ImmutableFieldLiteGenerator::ImmutableFieldLiteGenerator(in_RDI);
  in_RDI->_vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMessageFieldLiteGenerator_008973b0;
  in_RDI[1]._vptr_ImmutableFieldLiteGenerator = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x59004c);
  *(undefined4 *)&in_RDI[8]._vptr_ImmutableFieldLiteGenerator = in_EDX;
  pCVar1 = Context::GetNameResolver((Context *)0x59006b);
  in_RDI[9]._vptr_ImmutableFieldLiteGenerator = (_func_int **)pCVar1;
  Context::GetFieldGeneratorInfo(in_stack_00000010,in_stack_00000008);
  anon_unknown_5::SetMessageVariables
            (in_stack_000005f0,in_stack_000005ec,in_stack_000005e8,in_stack_000005e0,
             in_stack_000005d8,in_stack_000005d0);
  return;
}

Assistant:

ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : descriptor_(descriptor),
      messageBitIndex_(messageBitIndex),
      name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, 0,
                      context->GetFieldGeneratorInfo(descriptor),
                      name_resolver_, &variables_);
}